

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

int64_t __thiscall TPZFront<double>::NFree(TPZFront<double> *this)

{
  int64_t iVar1;
  long *plVar2;
  long in_RDI;
  int64_t free_eq;
  int64_t i;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_10 = 0;
  while( true ) {
    iVar1 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10));
    if (iVar1 <= local_10) break;
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_10);
    if (*plVar2 == -1) {
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return local_18;
}

Assistant:

int64_t TPZFront<TVar>::NFree()
{
	int64_t i;
	int64_t free_eq=0;
	for(i=0;i<fGlobal.NElements();i++)
	{
		if(fGlobal[i]==-1){
			free_eq=free_eq+1;
		}
	}
	return free_eq;
}